

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
* __thiscall
slang::parsing::Preprocessor::getDefinedMacros
          (vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
           *__return_storage_ptr__,Preprocessor *this)

{
  pointer *pppDVar1;
  char_pointer puVar2;
  DefineDirectiveSyntax *pDVar3;
  iterator __position;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __first;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __last;
  uint uVar4;
  long lVar5;
  char_pointer puVar6;
  ulong uVar7;
  uint uVar8;
  identity *piVar10;
  identity *extraout_RDX_00;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  _Var11;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __i;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __last_00;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __lasti;
  char_pointer puVar12;
  undefined1 auVar13 [16];
  _Val_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp;
  iterator iVar14;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_02;
  identity local_2a;
  less local_29;
  table_element_pointer ppVar9;
  identity *extraout_RDX;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar14 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
           ::begin(&(this->macros).table_);
  ppVar9 = iVar14.p_;
joined_r0x003011b4:
  if (ppVar9 == (table_element_pointer)0x0) {
    __first._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar7 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_02._M_comp.__proj = &local_2a;
      __comp_02._M_comp.__comp = &local_29;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::parsing::Preprocessor::getDefinedMacros()const::__0,std::identity>(slang::parsing::Preprocessor::getDefinedMacros()const::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp_02);
      if ((long)__last._M_current - (long)__first._M_current < 0x81) {
        __comp_01._M_comp.__proj = &local_2a;
        __comp_01._M_comp.__comp = &local_29;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::parsing::Preprocessor::getDefinedMacros()const::__0,std::identity>(slang::parsing::Preprocessor::getDefinedMacros()const::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (__first,__last,__comp_01);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        __comp_00._M_comp.__proj = &local_2a;
        __comp_00._M_comp.__comp = &local_29;
        _Var11._M_current = __last_00._M_current;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::parsing::Preprocessor::getDefinedMacros()const::__0,std::identity>(slang::parsing::Preprocessor::getDefinedMacros()const::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (__first,__last_00,__comp_00);
        piVar10 = extraout_RDX;
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          __comp._M_comp.__proj = piVar10;
          __comp._M_comp.__comp = (less *)_Var11._M_current;
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<std::ranges::__detail::__make_comp_proj<slang::parsing::Preprocessor::getDefinedMacros()const::__0,std::identity>(slang::parsing::Preprocessor::getDefinedMacros()const::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                    (__last_00,__comp);
          piVar10 = extraout_RDX_00;
        }
      }
    }
    return __return_storage_ptr__;
  }
  pDVar3 = ((iVar14.p_)->second).syntax;
  if (pDVar3 != (DefineDirectiveSyntax *)0x0) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>
      ::_M_realloc_insert<slang::syntax::DefineDirectiveSyntax_const*const&>
                ((vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>
                  *)__return_storage_ptr__,__position,&((iVar14.p_)->second).syntax);
    }
    else {
      *__position._M_current = pDVar3;
      pppDVar1 = &(__return_storage_ptr__->
                  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
  }
  puVar6 = iVar14.pc_ + 2;
  do {
    puVar12 = puVar6;
    puVar6 = iVar14.pc_;
    ppVar9 = iVar14.p_ + 1;
    if (((uint)iVar14.pc_ & 0xf) == 0xe) goto LAB_00301227;
    puVar2 = puVar12 + -1;
    iVar14.p_ = ppVar9;
    iVar14.pc_ = puVar6 + 1;
    puVar6 = puVar12 + 1;
  } while (*puVar2 == '\0');
  puVar12 = puVar12 + -1;
  if (*puVar2 == '\x01') {
    ppVar9 = (table_element_pointer)0x0;
  }
  goto LAB_0030121b;
LAB_00301227:
  do {
    auVar13[0] = -(*puVar12 == '\0');
    auVar13[1] = -(puVar12[1] == '\0');
    auVar13[2] = -(puVar12[2] == '\0');
    auVar13[3] = -(puVar12[3] == '\0');
    auVar13[4] = -(puVar12[4] == '\0');
    auVar13[5] = -(puVar12[5] == '\0');
    auVar13[6] = -(puVar12[6] == '\0');
    auVar13[7] = -(puVar12[7] == '\0');
    auVar13[8] = -(puVar12[8] == '\0');
    auVar13[9] = -(puVar12[9] == '\0');
    auVar13[10] = -(puVar12[10] == '\0');
    auVar13[0xb] = -(puVar12[0xb] == '\0');
    auVar13[0xc] = -(puVar12[0xc] == '\0');
    auVar13[0xd] = -(puVar12[0xd] == '\0');
    auVar13[0xe] = -(puVar12[0xe] == '\0');
    auVar13[0xf] = -(puVar12[0xf] == '\0');
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
    if (uVar8 == 0x7fff) {
      puVar12 = puVar12 + 0x10;
      ppVar9 = ppVar9 + 0xf;
    }
    else {
      uVar4 = 0;
      if ((uVar8 ^ 0x7fff) != 0) {
        for (; ((uVar8 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if (puVar12[uVar4] == '\x01') {
        ppVar9 = (table_element_pointer)0x0;
      }
      else {
        puVar12 = puVar12 + uVar4;
        ppVar9 = (table_element_pointer)((long)&(ppVar9->first)._M_len + (ulong)(uVar4 << 5));
      }
    }
  } while (uVar8 == 0x7fff);
LAB_0030121b:
  iVar14.p_ = ppVar9;
  iVar14.pc_ = puVar12;
  goto joined_r0x003011b4;
}

Assistant:

std::vector<const DefineDirectiveSyntax*> Preprocessor::getDefinedMacros() const {
    std::vector<const DefineDirectiveSyntax*> results;
    for (auto& [name, def] : macros) {
        if (def.syntax)
            results.push_back(def.syntax);
    }

    std::ranges::sort(results, [](const DefineDirectiveSyntax* a, const DefineDirectiveSyntax* b) {
        return a->name.valueText() < b->name.valueText();
    });
    return results;
}